

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_stalker.cpp
# Opt level: O3

int AF_A_StalkerAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  FState *newstate;
  AActor *this;
  VMValue *pVVar8;
  AActor *pAVar9;
  char *__assertion;
  bool bVar10;
  bool bVar11;
  FName local_38;
  FName local_34;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f7d09;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005f7cf9;
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_005f7b1c;
    pPVar7 = (this->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar10 = pPVar7 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    bVar11 = pPVar7 == pPVar3;
    if (!bVar11 && !bVar10) {
      do {
        pPVar7 = pPVar7->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    pVVar8 = (VMValue *)(ulong)(bVar11 || bVar10);
    uVar5 = (uint)bVar10;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005f7d09;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_005f7cf9;
LAB_005f7b1c:
    this = (AActor *)0x0;
    pVVar8 = param;
    uVar5 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005f7cf9:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005f7d09;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar7 = (PClass *)puVar2[1];
          if (pPVar7 == (PClass *)0x0) {
            pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar5,ret);
            puVar2[1] = pPVar7;
          }
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar3 && bVar10) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar10 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar3) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (!bVar10) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005f7d09;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005f7cf9;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005f7d09:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                    ,0x3c,"int AF_A_StalkerAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  if (((this->flags).Value & 0x200) != 0) {
    local_34.Index = FName::NameManager::FindName(&FName::NameData,"Drop",false);
    newstate = AActor::FindState(this,&local_34);
    AActor::SetState(this,newstate,false);
    return 0;
  }
  pAVar9 = (this->target).field_0.p;
  if (pAVar9 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  A_FaceTarget(this);
  bVar10 = AActor::CheckMeleeRange(this);
  if (!bVar10) {
    return 0;
  }
  uVar5 = FRandom::GenRand32(&pr_stalker);
  iVar4 = (uVar5 & 7) * 2 + 2;
  pAVar9 = (this->target).field_0.p;
  if (pAVar9 == (AActor *)0x0) {
LAB_005f7c4e:
    pAVar9 = (AActor *)0x0;
  }
  else if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    goto LAB_005f7c4e;
  }
  local_38.Index = 0x84;
  local_30.Degrees = 0.0;
  iVar6 = P_DamageMobj(pAVar9,this,this,iVar4,&local_38,0,&local_30);
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  pAVar9 = (this->target).field_0.p;
  if (pAVar9 != (AActor *)0x0) {
    if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005f7ca0;
    (this->target).field_0.p = (AActor *)0x0;
  }
  pAVar9 = (AActor *)0x0;
LAB_005f7ca0:
  P_TraceBleed(iVar4,pAVar9,this);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_StalkerAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (self->flags & MF_NOGRAVITY)
	{
		self->SetState (self->FindState("Drop"));
	}
	else if (self->target != NULL)
	{
		A_FaceTarget (self);
		if (self->CheckMeleeRange ())
		{
			int damage = (pr_stalker() & 7) * 2 + 2;

			int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		}
	}
	return 0;
}